

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderOperatorTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::OperatorShaderEvaluator::evaluate
          (OperatorShaderEvaluator *this,ShaderEvalContext *ctx)

{
  float fVar1;
  float fVar2;
  bool *pbVar3;
  float *pfVar4;
  float fVar5;
  int local_1c;
  int i;
  ShaderEvalContext *ctx_local;
  OperatorShaderEvaluator *this_local;
  
  (*this->m_evalFunc)(ctx);
  if ((this->m_areScaleAndBiasEvaluated & 1U) == 0) {
    fVar5 = FloatScalar::getValue(&this->m_scale,this->m_gl,this->m_shaderType);
    this->m_evaluatedScale = fVar5;
    fVar5 = FloatScalar::getValue(&this->m_bias,this->m_gl,this->m_shaderType);
    this->m_evaluatedBias = fVar5;
    this->m_areScaleAndBiasEvaluated = true;
  }
  for (local_1c = 0; local_1c < 4; local_1c = local_1c + 1) {
    pbVar3 = tcu::Vector<bool,_4>::operator[]
                       ((Vector<bool,_4> *)
                        (s_outSwizzleChannelMasks + (long)(this->m_resultScalarSize + -1) * 4),
                        local_1c);
    if ((*pbVar3 & 1U) != 0) {
      pfVar4 = tcu::Vector<float,_4>::operator[](&ctx->color,local_1c);
      fVar5 = *pfVar4;
      fVar1 = this->m_evaluatedScale;
      fVar2 = this->m_evaluatedBias;
      pfVar4 = tcu::Vector<float,_4>::operator[](&ctx->color,local_1c);
      *pfVar4 = fVar5 * fVar1 + fVar2;
    }
  }
  return;
}

Assistant:

virtual void evaluate (ShaderEvalContext& ctx)
	{
		m_evalFunc(ctx);

		if (!m_areScaleAndBiasEvaluated)
		{
			m_evaluatedScale	= m_scale.getValue(m_gl, m_shaderType);
			m_evaluatedBias		= m_bias.getValue(m_gl, m_shaderType);
			m_areScaleAndBiasEvaluated = true;
		}

		for (int i = 0; i < 4; i++)
			if (s_outSwizzleChannelMasks[m_resultScalarSize-1][i])
				ctx.color[i] = ctx.color[i] * m_evaluatedScale + m_evaluatedBias;
	}